

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

SoapySDRArgInfo *
SoapySDRDevice_getChannelSensorInfo
          (SoapySDRArgInfo *__return_storage_ptr__,SoapySDRDevice *device,int direction,
          size_t channel,char *key)

{
  undefined1 *puVar1;
  allocator local_139;
  string local_138 [32];
  ArgInfo local_118;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_138,key,&local_139);
  (**(code **)(*(long *)device + 0x2d8))(&local_118,device,direction,channel,local_138);
  toArgInfo(__return_storage_ptr__,&local_118);
  SoapySDR::ArgInfo::~ArgInfo(&local_118);
  std::__cxx11::string::~string(local_138);
  return __return_storage_ptr__;
}

Assistant:

SoapySDRArgInfo SoapySDRDevice_getChannelSensorInfo(const SoapySDRDevice *device, const int direction, const size_t channel, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toArgInfo(device->getSensorInfo(direction, channel, key));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRArgInfoNull());
}